

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall CLayer::CLayer(CLayer *this)

{
  CLayer *this_local;
  
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CLayer_001cdba0;
  std::
  multimap<int,_CBoundary_*,_std::less<int>,_std::allocator<std::pair<const_int,_CBoundary_*>_>_>::
  multimap(&this->m_CBoundaryBucket);
  __gnu_cxx::
  hash_map<long_long,_std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_int,_CBoundary_*>_>_>_>
  ::hash_map(&this->m_CBoundaryBucketItr);
  this->m_ppGrid = (CGrid **)0x0;
  this->m_ppBoundary = (CBoundary **)0x0;
  this->m_iSumWL = 0;
  this->m_iMaxBY = 0;
  this->m_iMaxBX = 0;
  return;
}

Assistant:

CLayer::CLayer()
{
	m_ppGrid			=	NULL;
	m_ppBoundary		=	NULL;
	m_iSumWL			=	0;	
	m_iMaxBY			=	0;
	m_iMaxBX			=	0;
	//m_iTargetCapacity	=	-1;
	//m_dTargetCongestion	=	0;
}